

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Gia_Man_t * Abc_NtkClpGia(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int c;
  Gia_Man_t *p;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pNode;
  Gia_Man_t *pNew;
  int iLit;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    p = Gia_ManStart(1000);
    pcVar2 = Abc_UtilStrsav(pNtk->pName);
    p->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(pNtk->pSpec);
    p->pSpec = pcVar2;
    for (pNew._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), pNew._4_4_ < iVar1;
        pNew._4_4_ = pNew._4_4_ + 1) {
      pAVar3 = Abc_NtkObj(pNtk,pNew._4_4_);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        (pAVar3->field_6).iTemp = -1;
      }
    }
    pAVar3 = Abc_AigConst1(pNtk);
    (pAVar3->field_6).iTemp = 1;
    for (pNew._4_4_ = 0; iVar1 = Abc_NtkCiNum(pNtk), pNew._4_4_ < iVar1; pNew._4_4_ = pNew._4_4_ + 1
        ) {
      pAVar3 = Abc_NtkCi(pNtk,pNew._4_4_);
      iVar1 = Gia_ManAppendCi(p);
      (pAVar3->field_6).iTemp = iVar1;
    }
    for (pNew._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtk), pNew._4_4_ < iVar1; pNew._4_4_ = pNew._4_4_ + 1
        ) {
      pAVar3 = Abc_NtkCo(pNtk,pNew._4_4_);
      pNode_00 = Abc_ObjFanin0(pAVar3);
      iVar1 = Abc_NtkClpGia_rec(p,pNode_00);
      c = Abc_ObjFaninC0(pAVar3);
      iVar1 = Abc_LitNotCond(iVar1,c);
      Gia_ManAppendCo(p,iVar1);
    }
    return p;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                ,0x243,"Gia_Man_t *Abc_NtkClpGia(Abc_Ntk_t *)");
}

Assistant:

Gia_Man_t * Abc_NtkClpGia( Abc_Ntk_t * pNtk )
{
    int i, iLit;
    Gia_Man_t * pNew;
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsStrash(pNtk) );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pNtk->pName );
    pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->iTemp = -1;
    Abc_AigConst1(pNtk)->iTemp = 1;
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->iTemp = Gia_ManAppendCi(pNew);
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        iLit = Abc_NtkClpGia_rec( pNew, Abc_ObjFanin0(pNode) );
        iLit = Abc_LitNotCond( iLit, Abc_ObjFaninC0(pNode) );
        Gia_ManAppendCo( pNew, iLit );
    }
    return pNew;
}